

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int nsc_regen(lws_cache_nscookiejar_t *cache,char *wc_delete,void *pay,size_t pay_size)

{
  int fd;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar4;
  nsc_regen_ctx ctx;
  char filepath [128];
  char *local_e0;
  void *local_d8;
  lws_usec_t local_d0;
  size_t local_c8;
  int local_c0;
  undefined1 local_bc;
  char local_b8 [136];
  
  fd = nsc_backing_open_lock(cache,0x140d38,(char *)pay);
  if (fd < 0) {
    return 1;
  }
  lws_snprintf(local_b8,0x80,"%s.tmp",(cache->cache).info.u,in_R8,in_R9,wc_delete);
  unlink(local_b8);
  iVar1 = open(local_b8,0x41,0x180);
  iVar4 = 1;
  local_c0 = iVar1;
  if (iVar1 < 0) goto LAB_0010f97b;
  sVar2 = write(iVar1,"# Netscape HTTP Cookie File\n",0x1c);
  if ((sVar2 == 0x1c) &&
     ((pay == (void *)0x0 ||
      ((sVar3 = write(iVar1,pay,pay_size & 0xffffffff), sVar3 == pay_size &&
       (sVar2 = write(iVar1,"\n",1), sVar2 == 1)))))) {
    (cache->cache).current_footprint = 0;
    local_e0 = wc_delete;
    local_d8 = pay;
    local_c8 = pay_size;
    local_d0 = lws_now_usecs();
    local_bc = 0;
    cache->earliest_expiry = 0;
    iVar1 = nscookiejar_iterate(cache,fd,nsc_regen_cb,&local_e0);
    if (iVar1 == 0) {
      close(local_c0);
      local_c0 = -1;
      iVar1 = unlink((char *)(cache->cache).info.u);
      if (iVar1 == -1) {
        _lws_log(8,"%s: unlink %s failed\n","nsc_regen",(cache->cache).info.u);
      }
      iVar1 = rename(local_b8,(char *)(cache->cache).info.u);
      if (iVar1 == -1) {
        _lws_log(8,"%s: rename %s failed\n","nsc_regen",(cache->cache).info.u);
      }
      iVar4 = 0;
      if (cache->earliest_expiry != 0) {
        lws_cache_schedule(&cache->cache,expiry_cb,cache->earliest_expiry);
      }
      goto LAB_0010f97b;
    }
    iVar1 = local_c0;
    if (local_c0 < 0) goto LAB_0010f97b;
  }
  close(iVar1);
LAB_0010f97b:
  unlink(local_b8);
  nsc_backing_close_unlock(cache,fd);
  return iVar4;
}

Assistant:

static int
nsc_regen(lws_cache_nscookiejar_t *cache, const char *wc_delete,
	  const void *pay, size_t pay_size)
{
	struct nsc_regen_ctx ctx;
	char filepath[128];
	int fd, ret = 1;

	fd = nsc_backing_open_lock(cache, LWS_O_RDONLY, __func__);
	if (fd < 0)
		return 1;

	lws_snprintf(filepath, sizeof(filepath), "%s.tmp",
			cache->cache.info.u.nscookiejar.filepath);
	unlink(filepath);

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_temp_open"))
		goto bail;

	ctx.fdt = open(filepath, LWS_O_CREAT | LWS_O_WRONLY, 0600);
	if (ctx.fdt < 0)
		goto bail;

	/* magic header */

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_temp_write") ||
	/* other consumers insist to see this at start of cookie jar */
	    write(ctx.fdt, "# Netscape HTTP Cookie File\n", 28) != 28)
		goto bail1;

	/* if we are adding something, put it first */

	if (pay &&
	    write(ctx.fdt, pay, /*msvc*/(unsigned int)pay_size) !=
						    (ssize_t)pay_size)
		goto bail1;
	if (pay && write(ctx.fdt, "\n", 1u) != (ssize_t)1)
		goto bail1;

	cache->cache.current_footprint = 0;

	ctx.wildcard_key_delete = wc_delete;
	ctx.add_data = pay;
	ctx.add_size = pay_size;
	ctx.curr = lws_now_usecs();
	ctx.drop = 0;

	cache->earliest_expiry = 0;

	if (lws_fi(&cache->cache.info.cx->fic, "cache_regen_iter_fail") ||
	    nscookiejar_iterate(cache, fd, nsc_regen_cb, &ctx))
		goto bail1;

	close(ctx.fdt);
	ctx.fdt = -1;

	if (unlink(cache->cache.info.u.nscookiejar.filepath) == -1)
		lwsl_info("%s: unlink %s failed\n", __func__,
			  cache->cache.info.u.nscookiejar.filepath);
	if (rename(filepath, cache->cache.info.u.nscookiejar.filepath) == -1)
		lwsl_info("%s: rename %s failed\n", __func__,
			  cache->cache.info.u.nscookiejar.filepath);

	if (cache->earliest_expiry)
		lws_cache_schedule(&cache->cache, expiry_cb,
				   cache->earliest_expiry);

	ret = 0;
	goto bail;

bail1:
	if (ctx.fdt >= 0)
		close(ctx.fdt);
bail:
	unlink(filepath);

	nsc_backing_close_unlock(cache, fd);

	return ret;
}